

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanSpace(QXmlStreamReaderPrivate *this)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    uVar1 = getChar(this);
    if (uVar1 != 9) {
      if (uVar1 != 10) {
        if (uVar1 != 0xd) {
          if (uVar1 != 0x20) {
            if (uVar1 != 0xffffffff) {
              puVar2 = QXmlStreamSimpleStack<unsigned_int>::push(&this->putStack);
              *puVar2 = uVar1;
            }
            return lVar3;
          }
          goto LAB_00359fab;
        }
        uVar1 = filterCarriageReturn(this);
        if (uVar1 == 0) {
          return lVar3;
        }
      }
      this->lineNumber = this->lineNumber + 1;
      this->lastLineStart = this->readBufferPos + this->characterOffset;
    }
LAB_00359fab:
    QString::append(&this->textBuffer,(QChar)(char16_t)uVar1);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanSpace()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (c) {
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            textBuffer += QChar(c);
            ++n;
            break;
        default:
            putChar(c);
            return n;
        }
    }
    return n;
}